

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

ly_set * lys_node_xpath_atomize(lys_node *node,int options)

{
  int iVar1;
  undefined4 uVar2;
  ly_set *set_00;
  LYS_NODE LVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  ulong uVar6;
  lys_node *node_00;
  uint uVar7;
  lys_node *plVar8;
  undefined1 local_78 [8];
  lyxp_set set;
  
  plVar8 = node;
  set._60_4_ = options;
  if (node == (lys_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_node_xpath_atomize");
  }
  else {
    do {
      if ((plVar8->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF)) != LYS_UNKNOWN) {
        set_00 = ly_set_new();
        plVar5 = node;
        if (set_00 == (ly_set *)0x0) {
          return (ly_set *)0x0;
        }
        do {
          do {
            do {
              node_00 = plVar5;
              if (((set._60_4_ & 2) == 0) || ((node_00->flags & 0x600) != 0)) {
                iVar1 = lyxp_node_atomize(node_00,(lyxp_set *)local_78,0);
                if (iVar1 != 0) {
LAB_0016104c:
                  ly_set_free(set_00);
                  free((void *)set._8_8_);
                  return (ly_set *)0x0;
                }
                if (set.val._8_4_ != 0) {
                  uVar7 = 0;
                  uVar2 = set.val._8_4_;
                  do {
                    uVar6 = (ulong)((uVar7 & 0xffff) << 4);
                    if (*(int *)(set._8_8_ + 8 + uVar6) == 2) {
                      plVar5 = *(lys_node **)(set._8_8_ + uVar6);
                      plVar4 = plVar5;
                      if ((set._60_4_ & 2) != 0) {
                        while ((plVar4 != (lys_node *)0x0 && (plVar4 != plVar8))) {
                          if (plVar4->nodetype == LYS_EXT) {
                            if (plVar4->padding[1] != '\x01') goto LAB_00160f40;
                            plVar4 = (lys_node *)plVar4->dsc;
                          }
                          else {
                            plVar4 = plVar4->parent;
                            if (plVar4 == (lys_node *)0x0) goto LAB_00160f40;
                          }
                          if (plVar4->nodetype == LYS_AUGMENT) {
                            plVar4 = plVar4->prev;
                          }
                        }
                        if (plVar4 != (lys_node *)0x0) goto LAB_00160f56;
                      }
LAB_00160f40:
                      iVar1 = ly_set_add(set_00,plVar5,0);
                      uVar2 = set.val._8_4_;
                      if (iVar1 == -1) goto LAB_0016104c;
                    }
LAB_00160f56:
                    uVar7 = uVar7 + 1;
                  } while ((uVar7 & 0xffff) < (uint)uVar2);
                }
                free((void *)set._8_8_);
                if ((set._60_4_ & 1) == 0) {
                  return set_00;
                }
              }
            } while (((node_00->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
                    (plVar5 = node_00->child, node_00->child != (lys_node *)0x0));
            if (node_00 == node) {
              return set_00;
            }
            plVar5 = node_00->next;
          } while (node_00->next != (lys_node *)0x0);
          do {
            node_00 = node_00->parent;
            LVar3 = node_00->nodetype;
            if (LVar3 == LYS_AUGMENT) {
              node_00 = node_00->prev;
              if (node_00 != (lys_node *)0x0) {
                LVar3 = node_00->nodetype;
                goto LAB_00160fc0;
              }
              node_00 = (lys_node *)0x0;
LAB_00160ff0:
              plVar5 = (lys_node *)0x0;
            }
            else {
LAB_00160fc0:
              if (LVar3 != LYS_EXT) {
                plVar5 = node_00->parent;
                if (plVar5 != (lys_node *)0x0) goto LAB_00160fde;
                goto LAB_00160ff0;
              }
              if (node_00->padding[1] != '\x01') goto LAB_00160ff0;
              plVar5 = (lys_node *)node_00->dsc;
LAB_00160fde:
              if (plVar5->nodetype == LYS_AUGMENT) {
                plVar5 = plVar5->prev;
              }
            }
            if (node->nodetype == LYS_EXT) {
              if (node->padding[1] == '\x01') {
                plVar4 = (lys_node *)node->dsc;
                goto LAB_00161012;
              }
LAB_00161021:
              plVar4 = (lys_node *)0x0;
            }
            else {
              plVar4 = node->parent;
              if (plVar4 == (lys_node *)0x0) goto LAB_00161021;
LAB_00161012:
              if (plVar4->nodetype == LYS_AUGMENT) {
                plVar4 = plVar4->prev;
              }
            }
            if (plVar5 == plVar4) {
              return set_00;
            }
            plVar5 = node_00->next;
          } while (node_00->next == (lys_node *)0x0);
        } while( true );
      }
      if (plVar8->nodetype == LYS_EXT) {
        if (plVar8->padding[1] != '\x01') {
          return (ly_set *)0x0;
        }
        plVar8 = (lys_node *)plVar8->dsc;
      }
      else {
        plVar8 = plVar8->parent;
        if (plVar8 == (lys_node *)0x0) {
          return (ly_set *)0x0;
        }
      }
      if (plVar8->nodetype == LYS_AUGMENT) {
        plVar8 = plVar8->prev;
      }
    } while (plVar8 != (lys_node *)0x0);
  }
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lys_node_xpath_atomize(const struct lys_node *node, int options)
{
    const struct lys_node *next, *elem, *parent, *tmp;
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint16_t i;

    if (!node) {
        LOGARG;
        return NULL;
    }

    for (parent = node; parent && !(parent->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT)); parent = lys_parent(parent));
    if (!parent) {
        /* not in input, output, or notification */
        return NULL;
    }

    ret_set = ly_set_new();
    if (!ret_set) {
        return NULL;
    }

    LY_TREE_DFS_BEGIN(node, next, elem) {
        if ((options & LYXP_NO_LOCAL) && !(elem->flags & (LYS_XPCONF_DEP | LYS_XPSTATE_DEP))) {
            /* elem has no dependencies from other subtrees and local nodes get discarded */
            goto next_iter;
        }

        if (lyxp_node_atomize(elem, &set, 0)) {
            ly_set_free(ret_set);
            free(set.val.snodes);
            return NULL;
        }

        for (i = 0; i < set.used; ++i) {
            switch (set.val.snodes[i].type) {
            case LYXP_NODE_ELEM:
                if (options & LYXP_NO_LOCAL) {
                    for (tmp = set.val.snodes[i].snode; tmp && (tmp != parent); tmp = lys_parent(tmp));
                    if (tmp) {
                        /* in local subtree, discard */
                        break;
                    }
                }
                if (ly_set_add(ret_set, set.val.snodes[i].snode, 0) == -1) {
                    ly_set_free(ret_set);
                    free(set.val.snodes);
                    return NULL;
                }
                break;
            default:
                /* ignore roots, text and attr should not ever appear */
                break;
            }
        }

        free(set.val.snodes);
        if (!(options & LYXP_RECURSIVE)) {
            break;
        }
next_iter:
        LY_TREE_DFS_END(node, next, elem);
    }

    return ret_set;
}